

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

bool llvm::itaniumFindTypesInMangledName
               (char *MangledName,void *Ctx,_func_void_void_ptr_char_ptr *Callback)

{
  Node **ppNVar1;
  Node **ppNVar2;
  ForwardTemplateReference **ppFVar3;
  BlockMeta *__ptr;
  size_t sVar4;
  Node *pNVar5;
  undefined1 local_1338 [752];
  BlockMeta local_1048 [256];
  BlockMeta *local_48;
  
  sVar4 = strlen(MangledName);
  local_1338._8_8_ = MangledName + sVar4;
  ppNVar1 = (Node **)(local_1338 + 0x28);
  local_1338._32_8_ = local_1338 + 0x128;
  ppNVar2 = (Node **)(local_1338 + 0x140);
  local_1338._312_8_ = local_1338 + 0x240;
  local_1338._576_8_ = local_1338 + 600;
  local_1338._592_8_ = local_1338 + 0x298;
  ppFVar3 = (ForwardTemplateReference **)(local_1338 + 0x2b0);
  local_1338._680_8_ = local_1338 + 0x2d0;
  local_1338[0x2e0] = true;
  local_1338[0x2e1] = false;
  local_1338[0x2e2] = false;
  local_1048[0].Next = (BlockMeta *)0x0;
  local_1048[0].Current = 0;
  local_1338._0_8_ = MangledName;
  local_1338._16_8_ = ppNVar1;
  local_1338._24_8_ = ppNVar1;
  local_1338._296_8_ = ppNVar2;
  local_1338._304_8_ = ppNVar2;
  local_1338._584_8_ = local_1338._576_8_;
  local_1338._664_8_ = ppFVar3;
  local_1338._672_8_ = ppFVar3;
  local_1338._720_8_ = Callback;
  local_1338._728_8_ = Ctx;
  local_48 = local_1048;
  pNVar5 = anon_unknown.dwarf_543c74::Db::parse((Db *)local_1338);
  while (__ptr = local_48, __ptr != (BlockMeta *)0x0) {
    local_48 = __ptr->Next;
    if (__ptr != local_1048) {
      free(__ptr);
    }
  }
  local_1048[0].Next = (BlockMeta *)0x0;
  local_1048[0].Current = 0;
  local_48 = local_1048;
  if ((ForwardTemplateReference **)local_1338._664_8_ != ppFVar3) {
    free((void *)local_1338._664_8_);
  }
  if ((undefined1 *)local_1338._576_8_ != local_1338 + 600) {
    free((void *)local_1338._576_8_);
  }
  if ((Node **)local_1338._296_8_ != ppNVar2) {
    free((void *)local_1338._296_8_);
  }
  if ((Node **)local_1338._16_8_ != ppNVar1) {
    free((void *)local_1338._16_8_);
  }
  return pNVar5 == (Node *)0x0;
}

Assistant:

bool llvm::itaniumFindTypesInMangledName(const char *MangledName, void *Ctx,
                                         void (*Callback)(void *,
                                                          const char *)) {
  Db Parser(MangledName, MangledName + std::strlen(MangledName));
  Parser.TypeCallback = Callback;
  Parser.TypeCallbackContext = Ctx;
  return Parser.parse() == nullptr;
}